

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O2

int h264_seqparm_mvc(bitstream *str,h264_seqparm *seqparm)

{
  int iVar1;
  int iVar2;
  h264_seqparm_mvc_view *phVar3;
  h264_seqparm_mvc_level *phVar4;
  h264_seqparm_mvc_applicable_op *phVar5;
  uint32_t *puVar6;
  h264_vui *phVar7;
  long lVar8;
  char *__ptr;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sStack_60;
  ulong local_50;
  long local_48;
  uint32_t bit_equal_to_one;
  uint32_t mvc_vui_parameters_present_flag;
  
  bit_equal_to_one = 1;
  if (str->dir == VS_DECODE) {
    seqparm->is_mvc = 1;
  }
  iVar1 = vs_u(str,&bit_equal_to_one,1);
  if (iVar1 != 0) {
    return 1;
  }
  if (bit_equal_to_one == 0) {
    fwrite("bit_equal_to_one invalid\n",0x19,1,_stderr);
    return 1;
  }
  puVar6 = &seqparm->num_views_minus1;
  iVar1 = vs_ue(str,puVar6);
  if (iVar1 != 0) {
    return 1;
  }
  if (str->dir == VS_DECODE) {
    phVar3 = (h264_seqparm_mvc_view *)calloc(0x104,(ulong)(seqparm->num_views_minus1 + 1));
    seqparm->views = phVar3;
  }
  uVar9 = 0xffffffffffffffff;
  lVar8 = 0;
  while( true ) {
    uVar11 = (ulong)*puVar6;
    uVar9 = uVar9 + 1;
    if (uVar11 < uVar9) break;
    iVar1 = vs_ue(str,(uint32_t *)((long)seqparm->views->anchor_ref_l0 + lVar8 + -8));
    lVar8 = lVar8 + 0x104;
    if (iVar1 != 0) {
      return 1;
    }
  }
  local_48 = 0x10c;
  local_50 = 0x14c;
  for (uVar9 = 1; uVar10 = 0xffffffffffffffff, uVar9 <= uVar11; uVar9 = uVar9 + 1) {
    iVar1 = vs_ue(str,&seqparm->views[uVar9].num_anchor_refs_l0);
    if (iVar1 != 0) {
      return 1;
    }
    lVar8 = local_48;
    if (0xf < seqparm->views[uVar9].num_anchor_refs_l0) {
      __ptr = "num_anchor_refs_l0 over limit\n";
LAB_00103799:
      sStack_60 = 0x1e;
      goto LAB_0010379b;
    }
    while( true ) {
      phVar3 = seqparm->views;
      uVar10 = uVar10 + 1;
      if (phVar3[uVar9].num_anchor_refs_l0 <= uVar10) break;
      iVar1 = vs_ue(str,(uint32_t *)((long)phVar3->anchor_ref_l0 + lVar8 + -8));
      lVar8 = lVar8 + 4;
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = vs_ue(str,&phVar3[uVar9].num_anchor_refs_l1);
    if (iVar1 != 0) {
      return 1;
    }
    if (0xf < seqparm->views[uVar9].num_anchor_refs_l1) {
      __ptr = "num_anchor_refs_l1 over limit\n";
      goto LAB_00103799;
    }
    uVar11 = 0xffffffffffffffff;
    uVar10 = local_50;
    while( true ) {
      uVar11 = uVar11 + 1;
      if (seqparm->views[uVar9].num_anchor_refs_l1 <= uVar11) break;
      lVar8 = uVar10 + -8;
      uVar10 = uVar10 + 4;
      iVar1 = vs_ue(str,(uint32_t *)((long)seqparm->views->anchor_ref_l0 + lVar8));
      if (iVar1 != 0) {
        return 1;
      }
    }
    uVar11 = (ulong)*puVar6;
    local_48 = local_48 + 0x104;
    local_50 = local_50 + 0x104;
  }
  uVar9 = 1;
  local_48 = 0x18c;
  local_50 = 0x1cc;
  while( true ) {
    iVar1 = 1;
    uVar10 = 0xffffffffffffffff;
    if (uVar11 < uVar9) {
      iVar2 = vs_ue(str,&seqparm->num_level_values_signalled_minus1);
      if (iVar2 == 0) {
        if (str->dir == VS_DECODE) {
          phVar4 = (h264_seqparm_mvc_level *)
                   calloc(0x10,(ulong)(seqparm->num_level_values_signalled_minus1 + 1));
          seqparm->levels = phVar4;
        }
        for (local_50 = 0; local_50 <= seqparm->num_level_values_signalled_minus1;
            local_50 = local_50 + 1) {
          iVar1 = vs_u(str,&seqparm->levels[local_50].level_idc,8);
          if ((iVar1 != 0) ||
             (iVar1 = vs_ue(str,&seqparm->levels[local_50].num_applicable_ops_minus1), iVar1 != 0))
          {
            return 1;
          }
          if (str->dir == VS_DECODE) {
            phVar4 = seqparm->levels;
            phVar5 = (h264_seqparm_mvc_applicable_op *)
                     calloc(0x18,(ulong)(phVar4[local_50].num_applicable_ops_minus1 + 1));
            phVar4[local_50].applicable_ops = phVar5;
          }
          uVar9 = 0;
          while (uVar9 <= seqparm->levels[local_50].num_applicable_ops_minus1) {
            iVar1 = vs_u(str,&seqparm->levels[local_50].applicable_ops[uVar9].temporal_id,3);
            if (iVar1 != 0) {
              return 1;
            }
            iVar1 = vs_ue(str,&seqparm->levels[local_50].applicable_ops[uVar9].
                               num_target_views_minus1);
            if (iVar1 != 0) {
              return 1;
            }
            if (str->dir == VS_DECODE) {
              phVar5 = seqparm->levels[local_50].applicable_ops;
              puVar6 = (uint32_t *)calloc(4,(ulong)(phVar5[uVar9].num_target_views_minus1 + 1));
              phVar5[uVar9].target_view_id = puVar6;
            }
            uVar11 = 0xffffffffffffffff;
            lVar8 = 0;
            while( true ) {
              phVar5 = seqparm->levels[local_50].applicable_ops;
              uVar11 = uVar11 + 1;
              if (phVar5[uVar9].num_target_views_minus1 < uVar11) break;
              iVar1 = vs_ue(str,(uint32_t *)(lVar8 + (long)phVar5[uVar9].target_view_id));
              lVar8 = lVar8 + 4;
              if (iVar1 != 0) {
                return 1;
              }
            }
            iVar1 = vs_ue(str,&phVar5[uVar9].num_views_minus1);
            uVar9 = uVar9 + 1;
            if (iVar1 != 0) {
              return 1;
            }
          }
        }
        mvc_vui_parameters_present_flag = (uint32_t)(seqparm->mvc_vui != (h264_vui *)0x0);
        iVar1 = 1;
        iVar2 = vs_u(str,&mvc_vui_parameters_present_flag,1);
        if (iVar2 == 0) {
          if (mvc_vui_parameters_present_flag != 0) {
            if (str->dir == VS_DECODE) {
              phVar7 = (h264_vui *)calloc(0x88,1);
              seqparm->mvc_vui = phVar7;
            }
            abort();
          }
          seqparm->mvc_vui = (h264_vui *)0x0;
          iVar1 = 0;
        }
      }
      return iVar1;
    }
    iVar1 = vs_ue(str,&seqparm->views[uVar9].num_non_anchor_refs_l0);
    if (iVar1 != 0) {
      return 1;
    }
    lVar8 = local_48;
    if (0xf < seqparm->views[uVar9].num_non_anchor_refs_l0) break;
    while( true ) {
      phVar3 = seqparm->views;
      uVar10 = uVar10 + 1;
      if (phVar3[uVar9].num_non_anchor_refs_l0 <= uVar10) break;
      iVar1 = vs_ue(str,(uint32_t *)((long)phVar3->anchor_ref_l0 + lVar8 + -8));
      lVar8 = lVar8 + 4;
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = vs_ue(str,&phVar3[uVar9].num_non_anchor_refs_l1);
    if (iVar1 != 0) {
      return 1;
    }
    uVar11 = 0xffffffffffffffff;
    uVar10 = local_50;
    if (0xf < seqparm->views[uVar9].num_non_anchor_refs_l1) {
      __ptr = "num_non_anchor_refs_l1 over limit\n";
      goto LAB_001037dc;
    }
    while( true ) {
      uVar11 = uVar11 + 1;
      if (seqparm->views[uVar9].num_non_anchor_refs_l1 <= uVar11) break;
      iVar1 = vs_ue(str,(uint32_t *)((long)seqparm->views->anchor_ref_l0 + uVar10 + -8));
      uVar10 = uVar10 + 4;
      if (iVar1 != 0) {
        return 1;
      }
    }
    uVar9 = uVar9 + 1;
    uVar11 = (ulong)*puVar6;
    local_48 = local_48 + 0x104;
    local_50 = local_50 + 0x104;
  }
  __ptr = "num_non_anchor_refs_l0 over limit\n";
LAB_001037dc:
  sStack_60 = 0x22;
LAB_0010379b:
  fwrite(__ptr,sStack_60,1,_stderr);
  return 1;
}

Assistant:

int h264_seqparm_mvc(struct bitstream *str, struct h264_seqparm *seqparm) {
	uint32_t bit_equal_to_one = 1;
	int i, j, k;
	if (str->dir == VS_DECODE)
		seqparm->is_mvc = 1;
	if (vs_u(str, &bit_equal_to_one, 1)) return 1;
	if (!bit_equal_to_one) {
		fprintf(stderr, "bit_equal_to_one invalid\n");
		return 1;
	}
	if (vs_ue(str, &seqparm->num_views_minus1)) return 1;
	if (str->dir == VS_DECODE)
		seqparm->views = calloc(sizeof *seqparm->views, seqparm->num_views_minus1 + 1);
	for (i = 0; i <= seqparm->num_views_minus1; i++)
		if (vs_ue(str, &seqparm->views[i].view_id)) return 1;
	for (i = 1; i <= seqparm->num_views_minus1; i++) {
		if (vs_ue(str, &seqparm->views[i].num_anchor_refs_l0)) return 1;
		if (seqparm->views[i].num_anchor_refs_l0 > 15) {
			fprintf (stderr, "num_anchor_refs_l0 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_anchor_refs_l0; j++)
			if (vs_ue(str, &seqparm->views[i].anchor_ref_l0[j])) return 1;
		if (vs_ue(str, &seqparm->views[i].num_anchor_refs_l1)) return 1;
		if (seqparm->views[i].num_anchor_refs_l1 > 15) {
			fprintf (stderr, "num_anchor_refs_l1 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_anchor_refs_l1; j++)
			if (vs_ue(str, &seqparm->views[i].anchor_ref_l1[j])) return 1;
	}
	for (i = 1; i <= seqparm->num_views_minus1; i++) {
		if (vs_ue(str, &seqparm->views[i].num_non_anchor_refs_l0)) return 1;
		if (seqparm->views[i].num_non_anchor_refs_l0 > 15) {
			fprintf (stderr, "num_non_anchor_refs_l0 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_non_anchor_refs_l0; j++)
			if (vs_ue(str, &seqparm->views[i].non_anchor_ref_l0[j])) return 1;
		if (vs_ue(str, &seqparm->views[i].num_non_anchor_refs_l1)) return 1;
		if (seqparm->views[i].num_non_anchor_refs_l1 > 15) {
			fprintf (stderr, "num_non_anchor_refs_l1 over limit\n");
			return 1;
		}
		for (j = 0; j < seqparm->views[i].num_non_anchor_refs_l1; j++)
			if (vs_ue(str, &seqparm->views[i].non_anchor_ref_l1[j])) return 1;
	}
	if (vs_ue(str, &seqparm->num_level_values_signalled_minus1)) return 1;
	if (str->dir == VS_DECODE)
		seqparm->levels = calloc(sizeof *seqparm->levels, seqparm->num_level_values_signalled_minus1 + 1);
	for (i = 0; i <= seqparm->num_level_values_signalled_minus1; i++) {
		if (vs_u(str, &seqparm->levels[i].level_idc, 8)) return 1;
		if (vs_ue(str, &seqparm->levels[i].num_applicable_ops_minus1)) return 1;
		if (str->dir == VS_DECODE)
			seqparm->levels[i].applicable_ops = calloc(sizeof *seqparm->levels[i].applicable_ops, seqparm->levels[i].num_applicable_ops_minus1 + 1);
		for (j = 0; j <= seqparm->levels[i].num_applicable_ops_minus1; j++) {
			if (vs_u(str, &seqparm->levels[i].applicable_ops[j].temporal_id, 3)) return 1;
			if (vs_ue(str, &seqparm->levels[i].applicable_ops[j].num_target_views_minus1)) return 1;
			if (str->dir == VS_DECODE)
				seqparm->levels[i].applicable_ops[j].target_view_id = calloc(sizeof *seqparm->levels[i].applicable_ops[j].target_view_id, seqparm->levels[i].applicable_ops[j].num_target_views_minus1 + 1);
			for (k = 0; k <= seqparm->levels[i].applicable_ops[j].num_target_views_minus1; k++)
				if (vs_ue(str, &seqparm->levels[i].applicable_ops[j].target_view_id[k])) return 1;
			if (vs_ue(str, &seqparm->levels[i].applicable_ops[j].num_views_minus1)) return 1;
		}
	}
	uint32_t mvc_vui_parameters_present_flag = !!(seqparm->mvc_vui);
	if (vs_u(str, &mvc_vui_parameters_present_flag, 1)) return 1;
	if (mvc_vui_parameters_present_flag) {
		if (str->dir == VS_DECODE) {
			seqparm->mvc_vui = calloc (sizeof *seqparm->mvc_vui, 1);
		}
		if (h264_mvc_vui_parameters(str, seqparm->mvc_vui)) return 1;
	} else {
		seqparm->mvc_vui = 0;
	}
	return 0;
}